

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int buffon_sample(double a,double l,int trial_num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (trial_num < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      iVar1 = rand();
      iVar2 = rand();
      dVar4 = cos(((double)iVar2 * 6.283185307179586) / 2147483647.0);
      dVar4 = dVar4 * l + ((double)iVar1 * a) / 2147483647.0;
      iVar3 = iVar3 + (uint)(a <= dVar4 || dVar4 <= 0.0);
      trial_num = trial_num + -1;
    } while (trial_num != 0);
  }
  return iVar3;
}

Assistant:

int buffon_sample ( double a, double l, int trial_num )

//****************************************************************************80
//
//  Purpose:
//
//    BUFFON_SAMPLE samples the Buffon PDF.
//
//  Discussion:
//
//    In the Buffon needle experiment, we suppose that the plane has been
//    ruled by vertical lines with a spacing of A units, and that a
//    needle of length L is dropped "at random" onto this grid.
//
//    Because of the various symmetries, we may assume that this eye of
//    this needle lands in the first infinite strip, and we may further
//    assume that its Y coordinate is 0.  Thus, we have
//    the eye as (X1,Y1) with 0 <= X1 <= A and Y1 = 0.
//
//    ANGLE, the angle that the needle makes is taken to be uniformly random.
//    The point of the needle, (X2,Y2), therefore lies at
//
//      (X2,Y2) = ( X1+L*cos(ANGLE), Y1+L*sin(ANGLE) )
//
//    The needle will have crossed at least one grid line if any of the
//    following are true:
//
//      X2 <= 0, A <= X2.
//
//    The probability of a crossing on a single trial is
//
//      P(A,L) = ( 2 * L ) / ( PI * A )
//
//    and therefore, a record of the number of hits for a given number of
//    trials can be used as a very roundabout way of estimating PI.
//
//    Since this routine invokes the C++ random number generator,
//    the user should initialize the random number generator, particularly
//    if it is desired to control whether the sequence is to be varied
//    or repeated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the horizontal spacing between the
//    vertical grid lines.  0 <= A.
//
//    Input, double L, the length of the needle.
//
//    Input, int TRIAL_NUM, the number of times the needle is
//    to be dropped onto the grid.
//
//    Output, int BUFFON_SAMPLE, the number of times the needle
//    crossed at least one line of the grid of cells.
//
{
  double angle;
  int hits;
  const double r8_pi = 3.141592653589793238462643;
  int trial;
  double x1;
  double x2;

  hits = 0;

  for ( trial = 1; trial <= trial_num; trial++ )
  {
//
//  Randomly choose the location (X1,Y1) of the eye of the needle
//  in [0,0]x[A,0], and the angle the needle makes.
//
    x1 = a * static_cast< double > ( rand ( )) / static_cast< double > (RAND_MAX);
    angle = 2.0 * r8_pi * static_cast< double > ( rand ( )) / static_cast< double > (RAND_MAX);
//
//  Compute the location of the point of the needle.
//  We only need to know the value of X2, not Y2!
//
    x2 = x1 + l * cos ( angle );
//
//  Count the end locations that lie outside the cell.
//
    if ( x2 <= 0.0 || a <= x2 )
    {
       hits = hits + 1;
    }
  }
  return hits;
}